

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmSqrMont(word *b,word *a,qr_o *r,void *stack)

{
  word *in_RCX;
  long in_RDX;
  word *in_RDI;
  word *prod;
  
  zzSqr(b,a,(size_t)r,stack);
  zzRedMont(b,a,(size_t)r,(word)stack,prod);
  wwCopy(in_RDI,in_RCX,*(size_t *)(in_RDX + 0x30));
  return;
}

Assistant:

static void zmSqrMont(word b[], const word a[], const qr_o* r, void* stack)
{
	word* prod = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	stack = prod + 2 * r->n;
	zzSqr(prod, a, r->n, stack);
	zzRedMont(prod, r->mod, r->n, *(word*)r->params, stack);
	wwCopy(b, prod, r->n);
}